

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<const_double> * __thiscall
kj::heapArray<double_const,double_const*>
          (Array<const_double> *__return_storage_ptr__,kj *this,double *begin,double *end)

{
  undefined1 local_40 [8];
  ArrayBuilder<const_double> builder;
  double *end_local;
  double *begin_local;
  
  builder.disposer = (ArrayDisposer *)begin;
  heapArrayBuilder<double_const>
            ((ArrayBuilder<const_double> *)local_40,(kj *)((long)begin - (long)this >> 3),
             (size_t)begin);
  ArrayBuilder<double_const>::addAll<double_const*,false>
            ((ArrayBuilder<double_const> *)local_40,(double *)this,(double *)builder.disposer);
  ArrayBuilder<const_double>::finish(__return_storage_ptr__,(ArrayBuilder<const_double> *)local_40);
  ArrayBuilder<const_double>::~ArrayBuilder((ArrayBuilder<const_double> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Array<T>
heapArray(Iterator begin, Iterator end) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(end - begin);
  builder.addAll(begin, end);
  return builder.finish();
}